

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

void __thiscall ON_Layer::~ON_Layer(ON_Layer *this)

{
  ON_LayerPrivate *pOVar1;
  
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00824450;
  pOVar1 = this->m_private;
  if (pOVar1 != (ON_LayerPrivate *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pOVar1->m_custom_section_style).
                super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    operator_delete(pOVar1,0x18);
  }
  ON_ClassArray<ON_MaterialRef>::~ON_ClassArray(&(this->m_rendering_attributes).m_materials);
  ON_ModelComponent::~ON_ModelComponent(&this->super_ON_ModelComponent);
  return;
}

Assistant:

ON_Layer::~ON_Layer()
{
  if (m_private)
    delete m_private;
}